

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Options * leveldb::SanitizeOptions
                    (Options *__return_storage_ptr__,string *dbname,InternalKeyComparator *icmp,
                    InternalFilterPolicy *ipolicy,Options *src)

{
  Env *pEVar1;
  Cache *pCVar2;
  long lVar3;
  Options *pOVar4;
  Options *pOVar5;
  long in_FS_OFFSET;
  Status s;
  void *local_88;
  void *local_80;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pOVar4 = src;
  pOVar5 = __return_storage_ptr__;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    pOVar5->comparator = pOVar4->comparator;
    pOVar4 = (Options *)&pOVar4->create_if_missing;
    pOVar5 = (Options *)&pOVar5->create_if_missing;
  }
  __return_storage_ptr__->comparator = &icmp->super_Comparator;
  if (src->filter_policy == (FilterPolicy *)0x0) {
    ipolicy = (InternalFilterPolicy *)0x0;
  }
  __return_storage_ptr__->filter_policy = &ipolicy->super_FilterPolicy;
  if (50000 < __return_storage_ptr__->max_open_files) {
    __return_storage_ptr__->max_open_files = 50000;
  }
  if (__return_storage_ptr__->max_open_files < 0x4a) {
    __return_storage_ptr__->max_open_files = 0x4a;
  }
  if (0x40000000 < (int)__return_storage_ptr__->write_buffer_size) {
    __return_storage_ptr__->write_buffer_size = 0x40000000;
  }
  if ((int)__return_storage_ptr__->write_buffer_size < 0x10000) {
    __return_storage_ptr__->write_buffer_size = 0x10000;
  }
  if (0x40000000 < (int)__return_storage_ptr__->max_file_size) {
    __return_storage_ptr__->max_file_size = 0x40000000;
  }
  if ((int)__return_storage_ptr__->max_file_size < 0x100000) {
    __return_storage_ptr__->max_file_size = 0x100000;
  }
  if (0x400000 < (int)__return_storage_ptr__->block_size) {
    __return_storage_ptr__->block_size = 0x400000;
  }
  if ((int)__return_storage_ptr__->block_size < 0x400) {
    __return_storage_ptr__->block_size = 0x400;
  }
  if (__return_storage_ptr__->info_log == (Logger *)0x0) {
    (*src->env->_vptr_Env[9])(&local_80,src->env,dbname);
    if (local_80 != (void *)0x0) {
      operator_delete__(local_80);
    }
    pEVar1 = src->env;
    InfoLogFileName(&local_58,dbname);
    OldInfoLogFileName(&local_78,dbname);
    (*pEVar1->_vptr_Env[0xc])(&local_88,pEVar1,&local_58,&local_78);
    if (local_88 != (void *)0x0) {
      operator_delete__(local_88);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    pEVar1 = src->env;
    InfoLogFileName(&local_58,dbname);
    (*pEVar1->_vptr_Env[0x12])(&local_78,pEVar1,&local_58,&__return_storage_ptr__->info_log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_78._M_dataplus._M_p != (pointer)0x0) {
      __return_storage_ptr__->info_log = (Logger *)0x0;
      operator_delete__(local_78._M_dataplus._M_p);
    }
  }
  if (__return_storage_ptr__->block_cache == (Cache *)0x0) {
    pCVar2 = NewLRUCache(0x800000);
    __return_storage_ptr__->block_cache = pCVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Options SanitizeOptions(const std::string& dbname,
                        const InternalKeyComparator* icmp,
                        const InternalFilterPolicy* ipolicy,
                        const Options& src) {
  Options result = src;
  result.comparator = icmp;
  result.filter_policy = (src.filter_policy != nullptr) ? ipolicy : nullptr;
  ClipToRange(&result.max_open_files, 64 + kNumNonTableCacheFiles, 50000);
  ClipToRange(&result.write_buffer_size, 64 << 10, 1 << 30);
  ClipToRange(&result.max_file_size, 1 << 20, 1 << 30);
  ClipToRange(&result.block_size, 1 << 10, 4 << 20);
  if (result.info_log == nullptr) {
    // Open a log file in the same directory as the db
    src.env->CreateDir(dbname);  // In case it does not exist
    src.env->RenameFile(InfoLogFileName(dbname), OldInfoLogFileName(dbname));
    Status s = src.env->NewLogger(InfoLogFileName(dbname), &result.info_log);
    if (!s.ok()) {
      // No place suitable for logging
      result.info_log = nullptr;
    }
  }
  if (result.block_cache == nullptr) {
    result.block_cache = NewLRUCache(8 << 20);
  }
  return result;
}